

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseCacheCoverage::SplitString
          (cmParseCacheCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *line)

{
  long lVar1;
  long lVar2;
  string arg;
  string local_50 [32];
  
  lVar1 = std::__cxx11::string::find((char)line,0x2c);
  if (lVar1 != -1) {
    arg._M_dataplus._M_p = (pointer)&arg.field_2;
    arg._M_string_length = 0;
    arg.field_2._M_local_buf[0] = '\0';
    lVar2 = lVar1;
    while (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)line);
      std::__cxx11::string::operator=((string *)&arg,local_50);
      std::__cxx11::string::~string(local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,&arg);
      lVar2 = std::__cxx11::string::find((char)line,0x2c);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)line);
    std::__cxx11::string::operator=((string *)&arg,local_50);
    std::__cxx11::string::~string(local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&arg);
    std::__cxx11::string::~string((string *)&arg);
  }
  return lVar1 != -1;
}

Assistant:

bool cmParseCacheCoverage::SplitString(std::vector<std::string>& args,
                                       std::string const& line)
{
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = line.find(',', 0);
  if (pos2 == std::string::npos) {
    return false;
  }
  std::string arg;
  while (pos2 != std::string::npos) {
    arg = line.substr(pos1, pos2 - pos1);
    args.push_back(arg);
    pos1 = pos2 + 1;
    pos2 = line.find(',', pos1);
  }
  arg = line.substr(pos1);
  args.push_back(arg);
  return true;
}